

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O1

uv_os_sock_t create_udp_socket(void)

{
  uint uVar1;
  int iVar2;
  uv_os_sock_t extraout_EAX;
  int iVar3;
  uv_os_sock_t extraout_EAX_00;
  uv_os_sock_t extraout_EAX_01;
  uint uVar4;
  uv_os_sock_t extraout_EAX_02;
  uv_os_sock_t extraout_EAX_03;
  uv_loop_t *puVar5;
  uv_loop_t *loop;
  undefined1 *in_RCX;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_udp_t *puVar6;
  undefined1 *puVar7;
  undefined8 *puVar8;
  uv_udp_t *handle;
  uv_handle_t *handle_00;
  ulong in_R8;
  int64_t eval_b;
  int64_t eval_a;
  int yes;
  undefined1 auStack_680 [16];
  uv_buf_t uStack_670;
  sockaddr sStack_660;
  undefined2 uStack_650;
  undefined1 uStack_64e;
  undefined5 uStack_64d;
  undefined8 uStack_648;
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined6 uStack_608;
  undefined2 uStack_602;
  undefined6 uStack_600;
  undefined8 uStack_5fa;
  uv_udp_t uStack_5e8;
  uv_udp_send_t uStack_530;
  uv_loop_t *puStack_3e8;
  code *pcStack_3e0;
  size_t sStack_3d8;
  size_t sStack_3d0;
  uv_buf_t uStack_3c8;
  sockaddr_in sStack_3b8;
  uv_udp_t uStack_3a8;
  uv_udp_t uStack_2f0;
  uv_loop_t *puStack_238;
  long lStack_228;
  long lStack_220;
  sockaddr_in sStack_218;
  uv_udp_t uStack_208;
  uv_loop_t *puStack_150;
  long lStack_148;
  long lStack_140;
  uv_udp_t uStack_138;
  uv_udp_t *puStack_80;
  undefined8 *puStack_58;
  ulong uStack_50;
  uv_udp_t *puStack_48;
  undefined8 uStack_38;
  code *pcStack_30;
  uv_handle_type local_20;
  undefined4 uStack_1c;
  uv_close_cb local_18;
  undefined4 local_c;
  
  pcStack_30 = (code *)0x1db785;
  uVar1 = socket(2,2,0);
  puVar6 = (uv_udp_t *)(ulong)uVar1;
  local_18 = (uv_close_cb)(long)(int)uVar1;
  local_20 = UV_UNKNOWN_HANDLE;
  uStack_1c = 0;
  if ((long)local_18 < 0) {
    pcStack_30 = (code *)0x1db7f8;
    create_udp_socket_cold_2();
  }
  else {
    in_RCX = (undefined1 *)&stack0xfffffffffffffff4;
    local_c = 1;
    in_R8 = 4;
    pcStack_30 = (code *)0x1db7c5;
    iVar2 = setsockopt(uVar1,1,2,in_RCX,4);
    local_18 = (uv_close_cb)(long)iVar2;
    local_20 = UV_UNKNOWN_HANDLE;
    uStack_1c = 0;
    if (local_18 == (uv_close_cb)0x0) {
      return uVar1;
    }
  }
  puVar7 = (undefined1 *)&stack0xffffffffffffffe0;
  pcStack_30 = alloc_cb;
  create_udp_socket_cold_1();
  uStack_38 = 0x10000;
  if ((long)puVar7 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x1008540;
  }
  handle = (uv_udp_t *)&stack0xffffffffffffffd0;
  puVar8 = &uStack_38;
  puStack_48 = (uv_udp_t *)recv_cb;
  pcStack_30 = (code *)puVar7;
  alloc_cb_cold_1();
  iVar2 = (int)&puStack_58;
  puStack_48 = puVar6;
  if ((long)puVar8 < 0) {
    recv_cb_cold_7();
LAB_001db91b:
    recv_cb_cold_1();
LAB_001db928:
    recv_cb_cold_5();
LAB_001db92d:
    recv_cb_cold_2();
LAB_001db93a:
    recv_cb_cold_3();
LAB_001db947:
    recv_cb_cold_4();
  }
  else {
    if (puVar8 != (undefined8 *)0x0) {
      uStack_50 = in_R8 & 0xffffffff;
      puStack_58 = (undefined8 *)0x0;
      if (uStack_50 != 0) goto LAB_001db91b;
      if (in_RCX == (undefined1 *)0x0) goto LAB_001db928;
      uStack_50 = 4;
      in_RCX = (undefined1 *)0x4;
      puStack_58 = puVar8;
      if (puVar8 != (undefined8 *)0x4) goto LAB_001db92d;
      iVar3 = memcmp("PING",(void *)*extraout_RDX_00,4);
      uStack_50 = (ulong)iVar3;
      puStack_58 = (undefined8 *)0x0;
      puVar6 = handle;
      if (uStack_50 != 0) goto LAB_001db93a;
      iVar3 = uv_udp_recv_stop(handle);
      uStack_50 = (ulong)iVar3;
      puStack_58 = (undefined8 *)0x0;
      if (uStack_50 == 0) {
        uv_close((uv_handle_t *)handle,close_cb);
        return extraout_EAX_00;
      }
      goto LAB_001db947;
    }
    iVar2 = 0;
    if (in_RCX == (undefined1 *)0x0) {
      return extraout_EAX;
    }
  }
  recv_cb_cold_6();
  if (in_RCX == (undefined1 *)0x0) {
    send_cb_cold_2();
  }
  else if (iVar2 == 0) {
    send_cb_called = send_cb_called + 1;
    uv_close(*(uv_handle_t **)(in_RCX + 0x48),close_cb);
    return extraout_EAX_01;
  }
  send_cb_cold_1();
  puStack_150 = (uv_loop_t *)0x1db9be;
  puStack_80 = puVar6;
  uVar1 = create_udp_socket();
  puStack_150 = (uv_loop_t *)0x1db9c5;
  uVar4 = create_udp_socket();
  loop = (uv_loop_t *)(ulong)uVar4;
  puStack_150 = (uv_loop_t *)0x1db9cc;
  puVar5 = uv_default_loop();
  puStack_150 = (uv_loop_t *)0x1db9d9;
  iVar2 = uv_udp_init(puVar5,&uStack_138);
  lStack_140 = (long)iVar2;
  lStack_148 = 0;
  if (lStack_140 == 0) {
    puStack_150 = (uv_loop_t *)0x1dba03;
    iVar2 = uv_udp_open(&uStack_138,uVar1);
    lStack_140 = (long)iVar2;
    lStack_148 = 0;
    if (lStack_140 != 0) goto LAB_001dbaf3;
    puStack_150 = (uv_loop_t *)0x1dba2d;
    iVar2 = uv_udp_open(&uStack_138,uVar4);
    lStack_140 = (long)iVar2;
    lStack_148 = -0x10;
    if (lStack_140 != -0x10) goto LAB_001dbb00;
    puStack_150 = (uv_loop_t *)0x1dba52;
    iVar2 = close(uVar4);
    lStack_140 = (long)iVar2;
    lStack_148 = 0;
    if (lStack_140 != 0) goto LAB_001dbb0d;
    puStack_150 = (uv_loop_t *)0x1dba7c;
    uv_close((uv_handle_t *)&uStack_138,(uv_close_cb)0x0);
    puStack_150 = (uv_loop_t *)0x1dba81;
    puVar5 = uv_default_loop();
    puStack_150 = (uv_loop_t *)0x1dba8b;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_150 = (uv_loop_t *)0x1dba90;
    loop = uv_default_loop();
    puStack_150 = (uv_loop_t *)0x1dbaa4;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_150 = (uv_loop_t *)0x1dbaae;
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_140 = 0;
    puStack_150 = (uv_loop_t *)0x1dbabc;
    puVar5 = uv_default_loop();
    puStack_150 = (uv_loop_t *)0x1dbac4;
    iVar2 = uv_loop_close(puVar5);
    lStack_148 = (long)iVar2;
    if (lStack_140 == lStack_148) {
      puStack_150 = (uv_loop_t *)0x1dbada;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_150 = (uv_loop_t *)0x1dbaf3;
    run_test_udp_open_twice_cold_1();
LAB_001dbaf3:
    puStack_150 = (uv_loop_t *)0x1dbb00;
    run_test_udp_open_twice_cold_2();
LAB_001dbb00:
    puStack_150 = (uv_loop_t *)0x1dbb0d;
    run_test_udp_open_twice_cold_3();
LAB_001dbb0d:
    puStack_150 = (uv_loop_t *)0x1dbb1a;
    run_test_udp_open_twice_cold_4();
  }
  puStack_150 = (uv_loop_t *)run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  puStack_238 = (uv_loop_t *)0x1dbb45;
  puStack_150 = loop;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_218);
  uStack_208.data = (void *)(long)iVar2;
  lStack_228 = 0;
  if (uStack_208.data == (void *)0x0) {
    puStack_238 = (uv_loop_t *)0x1dbb6a;
    uVar4 = create_udp_socket();
    loop = (uv_loop_t *)(ulong)uVar4;
    puStack_238 = (uv_loop_t *)0x1dbb7d;
    iVar2 = bind(uVar4,(sockaddr *)&sStack_218,0x10);
    uStack_208.data = (void *)(long)iVar2;
    lStack_228 = 0;
    if (uStack_208.data != (void *)0x0) goto LAB_001dbcb9;
    puStack_238 = (uv_loop_t *)0x1dbba2;
    puVar5 = uv_default_loop();
    puStack_238 = (uv_loop_t *)0x1dbbaf;
    iVar2 = uv_udp_init(puVar5,&uStack_208);
    lStack_228 = (long)iVar2;
    lStack_220 = 0;
    if (lStack_228 != 0) goto LAB_001dbcc8;
    puStack_238 = (uv_loop_t *)0x1dbbdb;
    iVar2 = uv_udp_open(&uStack_208,uVar4);
    lStack_228 = (long)iVar2;
    lStack_220 = 0;
    if (lStack_228 != 0) goto LAB_001dbcd7;
    puStack_238 = (uv_loop_t *)0x1dbc13;
    iVar2 = uv_udp_recv_start(&uStack_208,alloc_cb,recv_cb);
    lStack_228 = (long)iVar2;
    lStack_220 = 0;
    if (lStack_228 != 0) goto LAB_001dbce6;
    puStack_238 = (uv_loop_t *)0x1dbc3f;
    uv_close((uv_handle_t *)&uStack_208,(uv_close_cb)0x0);
    puStack_238 = (uv_loop_t *)0x1dbc44;
    puVar5 = uv_default_loop();
    puStack_238 = (uv_loop_t *)0x1dbc4e;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_238 = (uv_loop_t *)0x1dbc53;
    loop = uv_default_loop();
    puStack_238 = (uv_loop_t *)0x1dbc67;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_238 = (uv_loop_t *)0x1dbc71;
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_228 = 0;
    puStack_238 = (uv_loop_t *)0x1dbc7f;
    puVar5 = uv_default_loop();
    puStack_238 = (uv_loop_t *)0x1dbc87;
    iVar2 = uv_loop_close(puVar5);
    lStack_220 = (long)iVar2;
    if (lStack_228 == lStack_220) {
      puStack_238 = (uv_loop_t *)0x1dbc9f;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_238 = (uv_loop_t *)0x1dbcb9;
    run_test_udp_open_bound_cold_1();
LAB_001dbcb9:
    puStack_238 = (uv_loop_t *)0x1dbcc8;
    run_test_udp_open_bound_cold_2();
LAB_001dbcc8:
    puStack_238 = (uv_loop_t *)0x1dbcd7;
    run_test_udp_open_bound_cold_3();
LAB_001dbcd7:
    puStack_238 = (uv_loop_t *)0x1dbce6;
    run_test_udp_open_bound_cold_4();
LAB_001dbce6:
    puStack_238 = (uv_loop_t *)0x1dbcf5;
    run_test_udp_open_bound_cold_5();
  }
  puStack_238 = (uv_loop_t *)run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_3e0 = (code *)0x1dbd1d;
  puStack_238 = loop;
  uStack_3c8 = uv_buf_init("PING",4);
  pcStack_3e0 = (code *)0x1dbd3d;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_3b8);
  uStack_2f0.data = (void *)(long)iVar2;
  uStack_3a8.data = (void *)0x0;
  if (uStack_2f0.data == (void *)0x0) {
    pcStack_3e0 = (code *)0x1dbd68;
    uVar4 = create_udp_socket();
    loop = (uv_loop_t *)(ulong)uVar4;
    pcStack_3e0 = (code *)0x1dbd6f;
    puVar5 = uv_default_loop();
    pcStack_3e0 = (code *)0x1dbd7f;
    iVar2 = uv_udp_init(puVar5,&uStack_2f0);
    uStack_3a8.data = (void *)(long)iVar2;
    sStack_3d8 = 0;
    if (uStack_3a8.data != (void *)0x0) goto LAB_001dbfbd;
    pcStack_3e0 = (code *)0x1dbdae;
    iVar2 = connect(uVar4,(sockaddr *)&sStack_3b8,0x10);
    uStack_3a8.data = (void *)(long)iVar2;
    sStack_3d8 = 0;
    if (uStack_3a8.data != (void *)0x0) goto LAB_001dbfca;
    pcStack_3e0 = (code *)0x1dbddb;
    iVar2 = uv_udp_open(&uStack_2f0,uVar4);
    uStack_3a8.data = (void *)(long)iVar2;
    sStack_3d8 = 0;
    if (uStack_3a8.data != (void *)0x0) goto LAB_001dbfd7;
    pcStack_3e0 = (code *)0x1dbdfe;
    puVar5 = uv_default_loop();
    pcStack_3e0 = (code *)0x1dbe0b;
    iVar2 = uv_udp_init(puVar5,&uStack_3a8);
    sStack_3d8 = (size_t)iVar2;
    sStack_3d0 = 0;
    if (sStack_3d8 != 0) goto LAB_001dbfe4;
    pcStack_3e0 = (code *)0x1dbe3a;
    iVar2 = uv_udp_bind(&uStack_3a8,(sockaddr *)&sStack_3b8,0);
    sStack_3d8 = (size_t)iVar2;
    sStack_3d0 = 0;
    if (sStack_3d8 != 0) goto LAB_001dbff1;
    pcStack_3e0 = (code *)0x1dbe70;
    iVar2 = uv_udp_recv_start(&uStack_3a8,alloc_cb,recv_cb);
    sStack_3d8 = (size_t)iVar2;
    sStack_3d0 = 0;
    if (sStack_3d8 != 0) goto LAB_001dbffe;
    pcStack_3e0 = (code *)0x1dbeb6;
    iVar2 = uv_udp_send(&send_req,&uStack_2f0,&uStack_3c8,1,(sockaddr *)0x0,send_cb);
    sStack_3d8 = (size_t)iVar2;
    sStack_3d0 = 0;
    if (sStack_3d8 != 0) goto LAB_001dc00b;
    pcStack_3e0 = (code *)0x1dbed9;
    puVar5 = uv_default_loop();
    pcStack_3e0 = (code *)0x1dbee3;
    uv_run(puVar5,UV_RUN_DEFAULT);
    sStack_3d8 = 1;
    sStack_3d0 = (size_t)send_cb_called;
    if (sStack_3d0 != 1) goto LAB_001dc018;
    sStack_3d8 = 2;
    sStack_3d0 = (size_t)close_cb_called;
    if (sStack_3d0 != 2) goto LAB_001dc025;
    sStack_3d8 = uStack_2f0.send_queue_size;
    sStack_3d0 = 0;
    if (uStack_2f0.send_queue_size != 0) goto LAB_001dc032;
    pcStack_3e0 = (code *)0x1dbf52;
    loop = uv_default_loop();
    pcStack_3e0 = (code *)0x1dbf66;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStack_3e0 = (code *)0x1dbf70;
    uv_run(loop,UV_RUN_DEFAULT);
    sStack_3d8 = 0;
    pcStack_3e0 = (code *)0x1dbf7d;
    puVar5 = uv_default_loop();
    pcStack_3e0 = (code *)0x1dbf85;
    iVar2 = uv_loop_close(puVar5);
    sStack_3d0 = (size_t)iVar2;
    if (sStack_3d8 == sStack_3d0) {
      pcStack_3e0 = (code *)0x1dbfa0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_3e0 = (code *)0x1dbfbd;
    run_test_udp_open_connect_cold_1();
LAB_001dbfbd:
    pcStack_3e0 = (code *)0x1dbfca;
    run_test_udp_open_connect_cold_2();
LAB_001dbfca:
    pcStack_3e0 = (code *)0x1dbfd7;
    run_test_udp_open_connect_cold_3();
LAB_001dbfd7:
    pcStack_3e0 = (code *)0x1dbfe4;
    run_test_udp_open_connect_cold_4();
LAB_001dbfe4:
    pcStack_3e0 = (code *)0x1dbff1;
    run_test_udp_open_connect_cold_5();
LAB_001dbff1:
    pcStack_3e0 = (code *)0x1dbffe;
    run_test_udp_open_connect_cold_6();
LAB_001dbffe:
    pcStack_3e0 = (code *)0x1dc00b;
    run_test_udp_open_connect_cold_7();
LAB_001dc00b:
    pcStack_3e0 = (code *)0x1dc018;
    run_test_udp_open_connect_cold_8();
LAB_001dc018:
    pcStack_3e0 = (code *)0x1dc025;
    run_test_udp_open_connect_cold_9();
LAB_001dc025:
    pcStack_3e0 = (code *)0x1dc032;
    run_test_udp_open_connect_cold_10();
LAB_001dc032:
    pcStack_3e0 = (code *)0x1dc03f;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_3e0 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  handle_00 = (uv_handle_t *)auStack_680;
  puStack_3e8 = loop;
  pcStack_3e0 = (code *)(ulong)uVar1;
  uStack_670 = uv_buf_init("PING",4);
  puVar5 = uv_default_loop();
  uStack_64d = 0;
  uStack_648._0_4_ = 0;
  uStack_648._4_4_ = 0;
  uStack_640 = 0;
  uStack_638 = 0;
  uStack_630 = 0;
  uStack_628 = 0;
  uStack_620 = 0;
  uStack_618 = 0;
  uStack_610 = 0;
  uStack_608 = 0;
  uStack_602 = 0;
  uStack_600 = 0;
  uStack_5fa = 0;
  sStack_660.sa_family = 1;
  uStack_530.data = (void *)0x11;
  uStack_5e8.data = (void *)0x6c;
  builtin_strncpy(sStack_660.sa_data,"/tmp/uv-test-s",0xe);
  uStack_650 = 0x636f;
  uStack_64e = 0x6b;
  iVar2 = socket(1,1,0);
  uStack_530.data = (void *)(long)iVar2;
  uStack_5e8.data = (void *)0x0;
  if ((long)uStack_530.data < 0) {
    uStack_5e8.data = (void *)0x0;
    run_test_udp_send_unix_cold_8();
LAB_001dc302:
    run_test_udp_send_unix_cold_2();
LAB_001dc317:
    run_test_udp_send_unix_cold_3();
LAB_001dc32c:
    run_test_udp_send_unix_cold_4();
LAB_001dc33c:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    iVar3 = bind(iVar2,&sStack_660,0x6e);
    uStack_530.data = (void *)(long)iVar3;
    uStack_5e8.data = (void *)0x0;
    if (uStack_530.data != (void *)0x0) goto LAB_001dc302;
    iVar3 = listen(iVar2,1);
    uStack_530.data = (void *)(long)iVar3;
    uStack_5e8.data = (void *)0x0;
    if (uStack_530.data != (void *)0x0) goto LAB_001dc317;
    iVar3 = uv_udp_init(puVar5,&uStack_5e8);
    uStack_530.data = (void *)(long)iVar3;
    auStack_680._0_8_ = (uv_loop_t *)0x0;
    if (uStack_530.data != (void *)0x0) goto LAB_001dc32c;
    iVar3 = uv_udp_open(&uStack_5e8,iVar2);
    uStack_530.data = (void *)(long)iVar3;
    auStack_680._0_8_ = (uv_loop_t *)0x0;
    if (uStack_530.data != (void *)0x0) goto LAB_001dc33c;
    uv_run(puVar5,UV_RUN_DEFAULT);
    iVar3 = uv_udp_send(&uStack_530,&uStack_5e8,&uStack_670,1,(sockaddr *)&sStack_660,
                        (uv_udp_send_cb)0x0);
    auStack_680._0_8_ = SEXT48(iVar3);
    auStack_680._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_680._0_8_ == (uv_loop_t *)0x0) {
      uv_close((uv_handle_t *)&uStack_5e8,(uv_close_cb)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      close(iVar2);
      unlink("/tmp/uv-test-sock");
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      auStack_680._0_8_ = (uv_loop_t *)0x0;
      iVar2 = uv_loop_close(puVar5);
      auStack_680._8_8_ = SEXT48(iVar2);
      if (auStack_680._0_8_ == auStack_680._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001dc359;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_001dc359:
  run_test_udp_send_unix_cold_7();
  if (handle_00 != (uv_handle_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_02;
  }
  close_cb_cold_1();
  iVar2 = uv_is_closing(handle_00);
  if (iVar2 == 0) {
    uv_close(handle_00,(uv_close_cb)0x0);
    return extraout_EAX_03;
  }
  return iVar2;
}

Assistant:

static uv_os_sock_t create_udp_socket(void) {
  uv_os_sock_t sock;

  sock = socket(AF_INET, SOCK_DGRAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    int r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT_OK(r);
  }
#endif

  return sock;
}